

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::duel_cmd(int cid,char **args,int argc)

{
  char *s;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  clientinfo *ci;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  string f;
  stringformatter local_140;
  char local_138 [264];
  
  pcVar6 = args[1];
  s = args[2];
  bVar2 = QServ::getlastSA(&qs);
  uVar5 = mcduel;
  if ((((bVar2) && (args[1] != (char *)0x0)) && (args[2] != (char *)0x0)) &&
     ((*s != '\0' && (*pcVar6 != '\0')))) {
    uVar9 = (ulong)mcduel;
    bVar2 = (int)mcduel >= 0;
    if ((int)mcduel < 0) {
      uVar5 = 0;
    }
    else {
      iVar4 = strcmp(pcVar6,"ffa");
      if (iVar4 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = uVar5 + 1;
        uVar1 = 0;
        do {
          uVar8 = uVar1;
          if (uVar9 == uVar8) {
            bVar2 = uVar8 < uVar9;
            goto LAB_0015817b;
          }
          iVar4 = strcmp(pcVar6,qserv_modenames[uVar8 + 1]);
          uVar1 = uVar8 + 1;
        } while (iVar4 != 0);
        bVar2 = uVar8 < uVar9;
        uVar5 = (uint)(uVar8 + 1);
      }
      changemap(s,uVar5);
    }
LAB_0015817b:
    bVar3 = QServ::getlastSA(&qs);
    if ((bVar3 & bVar2) == 1) {
      iVar4 = QServ::getSender(&qs);
      ci = QServ::getClient(&qs,iVar4);
      persist = 1;
      pausegame(true,ci);
      iVar4 = dueltimermillis;
      if (dueltimermillis != 0) {
        do {
          iVar7 = iVar4 + -1;
          out(3,"\f2Get ready! Starting duel in %d:%d",(ulong)(uint)((iVar4 / 1000) % 1000));
          if (iVar7 == 0) break;
          iVar4 = iVar7;
        } while (iVar7 <= dueltimermillis);
      }
      pausegame(false,ci);
      local_140.buf = local_138;
      stringformatter::operator()
                (&local_140,"\f2Duel has started: %s on map %s. Good luck, have fun.",
                 qserv_modenames[uVar5],s);
      sendf(-1,1,"ris",0x23,local_138);
    }
    if (bVar2 != false) {
      return;
    }
    iVar4 = QServ::getSender(&qs);
    pcVar6 = "\f3Error: Unknown mode";
  }
  else {
    pcVar6 = local_138;
    local_140.buf = pcVar6;
    stringformatter::operator()(&local_140,"\f3Error: Invalid mode/mapname provided");
    iVar4 = QServ::getSender(&qs);
  }
  sendf(iVar4,1,"ris",0x23,pcVar6);
  return;
}

Assistant:

QSERV_CALLBACK duel_cmd(p) {
        const char *mapname = args[2];
        char *mn = args[1];
        if(CMD_SA && args[1] != NULL && args[2] != NULL && *mapname !=NULL && *mn!=NULL) {
            int gm; // default set to current mode td
            bool valid = false;
            
            // intialize this for perf
            for(int i = 0; i <= mcduel; i++)  {
                if(!strcmp(mn, qserv_modenames[i]))  {
                    gm = i;
                    // use other list to send full name of mode
                    changemap(mapname, gm);
                    valid = true;
                    break;
                }
            }
            if(CMD_SA && valid) {
                clientinfo *ci = qs.getClient(CMD_SENDER);
                server::persist = true;
                pausegame(true,ci);
                int dueltimer;
                for(dueltimer = dueltimermillis; dueltimer <= dueltimermillis && dueltimer != (0); --dueltimer) {
                    out(ECHO_SERV, "\f2Get ready! Starting duel in %d:%d",(dueltimer/1000) % 1000,dueltimer);
                }
                pausegame(false,ci);
                defformatstring(f)("\f2Duel has started: %s on map %s. Good luck, have fun.", qserv_modenames[gm], mapname);
                sendf(-1, 1, "ris", N_SERVMSG, f);
            }
            
            if(!valid) {sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Unknown mode");}
        }
        else {
            bool valid = false;
            defformatstring(f)("\f3Error: Invalid mode/mapname provided");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, f);
        }
    }